

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NameCataloger.cpp
# Opt level: O3

Action __thiscall
psy::C::NameCataloger::visitIdentifierDeclarator
          (NameCataloger *this,IdentifierDeclaratorSyntax *node)

{
  NameCatalog *this_00;
  string local_70;
  SyntaxToken local_50;
  
  SyntaxNode::tokenAtIndex(&local_50,(SyntaxNode *)node,node->identTkIdx_);
  SyntaxToken::valueText_abi_cxx11_(&local_70,&local_50);
  SyntaxToken::~SyntaxToken(&local_50);
  this_00 = (this->catalog_)._M_t.
            super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>.
            _M_t.
            super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
            .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl;
  if (this->withinTypedef_ == true) {
    NameCatalog::catalogUseAsTypeName(this_00,&local_70);
    NameCatalog::catalogDefAsTypeName
              ((this->catalog_)._M_t.
               super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
               .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,&local_70);
  }
  else {
    NameCatalog::catalogUseAsNonTypeName(this_00,&local_70);
    NameCatalog::catalogDefAsNonTypeName
              ((this->catalog_)._M_t.
               super___uniq_ptr_impl<psy::C::NameCatalog,_std::default_delete<psy::C::NameCatalog>_>
               ._M_t.
               super__Tuple_impl<0UL,_psy::C::NameCatalog_*,_std::default_delete<psy::C::NameCatalog>_>
               .super__Head_base<0UL,_psy::C::NameCatalog_*,_false>._M_head_impl,&local_70);
  }
  SyntaxVisitor::visit(&this->super_SyntaxVisitor,&node->init_->super_SyntaxNode);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return Skip;
}

Assistant:

SyntaxVisitor::Action NameCataloger::visitIdentifierDeclarator(const IdentifierDeclaratorSyntax* node)
{
    const auto& name = node->identifierToken().valueText();
    if (withinTypedef_) {
        catalog_->catalogUseAsTypeName(name);
        catalog_->catalogDefAsTypeName(name);
    } else {
        catalog_->catalogUseAsNonTypeName(name);
        catalog_->catalogDefAsNonTypeName(name);
    }

    visit(node->initializer());

    return Action::Skip;
}